

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

optional<int32_t> __thiscall
Commands::find_constant(Commands *this,string_view *value,bool context_free_only)

{
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *this_00;
  bool bVar1;
  const_iterator cVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  in_CL;
  undefined7 in_register_00000011;
  undefined1 uVar4;
  
  p_Var3 = (_Rb_tree_node_base *)value[10].__size;
  uVar4 = *(undefined1 *)&(this->commands)._M_t._M_impl;
  do {
    bVar1 = p_Var3 == (_Rb_tree_node_base *)&value[9].__size;
    if (bVar1) {
      *(undefined1 *)&(this->commands)._M_t._M_impl = uVar4;
LAB_0016358c:
      *(undefined1 *)&(this->commands)._M_t._M_impl = 0;
      (this->commands)._M_t._M_impl.field_0x4 = 0;
      return (optional<int32_t>)this;
    }
    this_00 = *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                **)(p_Var3 + 2);
    if (this_00[0x30] == in_CL) {
      cVar2 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_00,(basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT71(in_register_00000011,context_free_only));
      if (cVar2._M_node == (_Base_ptr)(this_00 + 8)) {
        (this->commands)._M_t._M_impl.field_0x4 = 0;
      }
      else {
        *(_Rb_tree_color *)&(this->commands)._M_t._M_impl.field_0x4 = cVar2._M_node[2]._M_color;
      }
      uVar4 = cVar2._M_node != (_Base_ptr)(this_00 + 8);
      if ((bool)uVar4) {
        *(undefined1 *)&(this->commands)._M_t._M_impl = uVar4;
        if (!bVar1) {
          return (optional<int32_t>)this;
        }
        goto LAB_0016358c;
      }
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

optional<int32_t> Commands::find_constant(const string_view& value, bool context_free_only) const
{
    for(auto& enum_pair : enums)
    {
        if(enum_pair.second->is_global == context_free_only)
        {
            if(auto opt = enum_pair.second->find(value))
                return opt;
        }
    }
    return nullopt;
}